

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::runtime_cs_ext::import(context_t *context,string *dir,string *name)

{
  proxy *in_RDI;
  string *in_stack_00000748;
  string *in_stack_00000750;
  instance_type *in_stack_00000758;
  namespace_t *in_stack_ffffffffffffffa8;
  
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x43b2cf);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x43b2db);
  cs::instance_type::import(in_stack_00000758,in_stack_00000750,in_stack_00000748);
  cs::make_namespace(in_stack_ffffffffffffffa8);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x43b30f);
  return (var)in_RDI;
}

Assistant:

var import(const context_t &context, const string &dir, const string &name)
		{
			try {
				return make_namespace(context->instance->import(dir, name));
			}
			catch (...) {
				return null_pointer;
			}
		}